

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::ClientContext::Execute
          (ClientContext *this,string *query,
          shared_ptr<duckdb::PreparedStatementData,_true> *prepared,
          PendingQueryParameters *parameters)

{
  string *query_00;
  pointer pPVar1;
  pointer *__ptr;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  undefined1 local_e8 [8];
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_> local_e0;
  undefined1 local_d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  element_type *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_c0;
  ErrorData local_b0;
  
  make_uniq<duckdb::ClientContextLock,std::mutex&>((duckdb *)&local_e0,(mutex *)(query + 0x12));
  query_00 = (string *)
             unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
             ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                          *)&local_e0);
  PendingQueryPreparedInternal
            ((ClientContext *)local_e8,(ClientContextLock *)query,query_00,prepared,parameters);
  pPVar1 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                         *)local_e8);
  if ((pPVar1->super_BaseQueryResult).success == false) {
    pPVar1 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                           *)local_e8);
    ErrorData::ErrorData(&local_b0,&(pPVar1->super_BaseQueryResult).error);
    local_d0._M_pi = &local_c0;
    local_c8 = (element_type *)0x0;
    local_c0._vptr__Sp_counted_base._0_1_ = 0;
    ErrorResult<duckdb::MaterializedQueryResult>
              ((ClientContext *)local_d8,(ErrorData *)query,(string *)&local_b0);
    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_d8;
    local_d8 = (undefined1  [8])0x0;
    ::std::__cxx11::string::~string((string *)&local_d0);
    ErrorData::~ErrorData(&local_b0);
  }
  else {
    pPVar1 = unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                           *)local_e8);
    unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>::
    operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
               *)&local_e0);
    PendingQueryResult::ExecuteInternal((PendingQueryResult *)this,(ClientContextLock *)pPVar1);
  }
  if ((_Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
       )local_e8 != (PendingQueryResult *)0x0) {
    (**(code **)(*(long *)local_e8 + 8))();
  }
  ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
  ~unique_ptr(&local_e0);
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult> ClientContext::Execute(const string &query, shared_ptr<PreparedStatementData> &prepared,
                                               const PendingQueryParameters &parameters) {
	auto lock = LockContext();
	auto pending = PendingQueryPreparedInternal(*lock, query, prepared, parameters);
	if (pending->HasError()) {
		return ErrorResult<MaterializedQueryResult>(pending->GetErrorObject());
	}
	return pending->ExecuteInternal(*lock);
}